

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O2

void __thiscall spvtools::opt::MergeReturnPass::AddReturnFlag(MergeReturnPass *this)

{
  IRContext *pIVar1;
  __uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> block;
  Instruction *inst;
  uint32_t uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t res_id;
  TypeManager *this_00;
  ConstantManager *this_01;
  Type *pTVar5;
  undefined4 extraout_var;
  Constant *c;
  Instruction *pIVar6;
  long lVar7;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  returnFlag;
  uint32_t local_128;
  uint local_124;
  SmallVector<unsigned_int,_2UL> local_120;
  iterator insert_iter;
  SmallVector<unsigned_int,_2UL> SStack_f0;
  undefined4 local_c8;
  SmallVector<unsigned_int,_2UL> local_c0;
  SmallVector<unsigned_int,_2UL> local_98;
  Bool temp;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (this->return_flag_ != (Instruction *)0x0) {
    return;
  }
  this_00 = IRContext::get_type_mgr((this->super_MemPass).super_Pass.context_);
  this_01 = IRContext::get_constant_mgr((this->super_MemPass).super_Pass.context_);
  temp.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  temp.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  temp.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  temp.super_Type.kind_ = kBool;
  temp.super_Type._vptr_Type = (_func_int **)&PTR__Type_008a8b68;
  uVar2 = analysis::TypeManager::GetTypeInstruction(this_00,&temp.super_Type);
  pTVar5 = analysis::TypeManager::GetType(this_00,uVar2);
  iVar3 = (*pTVar5->_vptr_Type[7])(pTVar5);
  local_120._vptr_SmallVector._0_4_ = 0;
  insert_iter.super_iterator.node_ = (iterator)(Instruction *)0x0;
  SStack_f0._vptr_SmallVector = (_func_int **)0x0;
  SStack_f0.size_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&insert_iter,&local_120);
  c = analysis::ConstantManager::GetConstant
                (this_01,(Type *)CONCAT44(extraout_var,iVar3),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&insert_iter);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&insert_iter);
  pIVar6 = analysis::ConstantManager::GetDefiningInstruction(this_01,c,0,(inst_iterator *)0x0);
  uVar4 = Instruction::result_id(pIVar6);
  uVar2 = analysis::TypeManager::FindPointerToType(this_00,uVar2,Function);
  res_id = Pass::TakeNextId((Pass *)this);
  pIVar6 = (Instruction *)::operator_new(0x70);
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  local_124 = 7;
  init_list._M_len = 1;
  init_list._M_array = &local_124;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_120,init_list);
  insert_iter.super_iterator.node_._0_4_ = 0x11;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_f0,&local_120);
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_128;
  local_128 = uVar4;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_98,init_list_00);
  local_c8 = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0,&local_98);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
             &insert_iter,&local_98);
  Instruction::Instruction(pIVar6,pIVar1,OpVariable,uVar2,res_id,(OperandList *)&local_48);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48);
  lVar7 = 0x38;
  do {
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)((long)&insert_iter.super_iterator.node_ + lVar7));
    lVar7 = lVar7 + -0x30;
  } while (lVar7 != -0x28);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_98);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_120);
  insert_iter.super_iterator.node_ =
       *(iterator *)
        ((long)(((this->function_->blocks_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t + 0x20);
  InstructionList::iterator::InsertBefore
            ((iterator *)&local_120,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&insert_iter);
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  block._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
       (((this->function_->blocks_).
         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t;
  inst = *(Instruction **)
          ((long)block._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x20);
  this->return_flag_ = inst;
  IRContext::AnalyzeDefUse(pIVar1,inst);
  IRContext::set_instr_block
            ((this->super_MemPass).super_Pass.context_,this->return_flag_,
             (BasicBlock *)
             block._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl);
  if (pIVar6 != (Instruction *)0x0) {
    (*(pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])();
  }
  analysis::Type::~Type(&temp.super_Type);
  return;
}

Assistant:

void MergeReturnPass::AddReturnFlag() {
  if (return_flag_) return;

  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();

  analysis::Bool temp;
  uint32_t bool_id = type_mgr->GetTypeInstruction(&temp);
  analysis::Bool* bool_type = type_mgr->GetType(bool_id)->AsBool();

  const analysis::Constant* false_const =
      const_mgr->GetConstant(bool_type, {false});
  uint32_t const_false_id =
      const_mgr->GetDefiningInstruction(false_const)->result_id();

  uint32_t bool_ptr_id =
      type_mgr->FindPointerToType(bool_id, spv::StorageClass::Function);

  uint32_t var_id = TakeNextId();
  std::unique_ptr<Instruction> returnFlag(new Instruction(
      context(), spv::Op::OpVariable, bool_ptr_id, var_id,
      std::initializer_list<Operand>{{SPV_OPERAND_TYPE_STORAGE_CLASS,
                                      {uint32_t(spv::StorageClass::Function)}},
                                     {SPV_OPERAND_TYPE_ID, {const_false_id}}}));

  auto insert_iter = function_->begin()->begin();

  insert_iter.InsertBefore(std::move(returnFlag));
  BasicBlock* entry_block = &*function_->begin();
  return_flag_ = &*entry_block->begin();
  context()->AnalyzeDefUse(return_flag_);
  context()->set_instr_block(return_flag_, entry_block);
}